

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

LY_ERR lyxml_ctx_new(ly_ctx *ctx,ly_in *in,lyxml_ctx **xmlctx_p)

{
  LY_ERR LVar1;
  LYXML_PARSER_STATUS LVar2;
  undefined8 in_RAX;
  lyxml_ctx *xmlctx;
  ly_bool closing;
  
  closing = (ly_bool)((ulong)in_RAX >> 0x38);
  xmlctx = (lyxml_ctx *)calloc(1,0x68);
  if (xmlctx == (lyxml_ctx *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxml_ctx_new");
    return LY_EMEM;
  }
  xmlctx->ctx = ctx;
  xmlctx->in = in;
  ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,(char *)0x0,in);
  LVar1 = lyxml_next_element(xmlctx,&(xmlctx->field_3).prefix,&(xmlctx->field_4).prefix_len,
                             &(xmlctx->field_5).name,&(xmlctx->field_6).name_len,&closing);
  if (LVar1 == LY_SUCCESS) {
    if (*xmlctx->in->current == '\0') {
      LVar2 = LYXML_END;
LAB_00197bfc:
      xmlctx->status = LVar2;
      *xmlctx_p = xmlctx;
      return LY_SUCCESS;
    }
    if (closing == '\0') {
      LVar1 = lyxml_open_element(xmlctx,(xmlctx->field_3).prefix,(xmlctx->field_4).prefix_len,
                                 (xmlctx->field_5).name,(xmlctx->field_6).name_len);
      if (LVar1 == LY_SUCCESS) {
        LVar2 = LYXML_ELEMENT;
        goto LAB_00197bfc;
      }
    }
    else {
      ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,"Stray closing element tag (\"%.*s\").",
              (ulong)*(uint *)&xmlctx->field_6);
      LVar1 = LY_EVALID;
    }
  }
  lyxml_ctx_free(xmlctx);
  return LVar1;
}

Assistant:

LY_ERR
lyxml_ctx_new(const struct ly_ctx *ctx, struct ly_in *in, struct lyxml_ctx **xmlctx_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxml_ctx *xmlctx;
    ly_bool closing;

    /* new context */
    xmlctx = calloc(1, sizeof *xmlctx);
    LY_CHECK_ERR_RET(!xmlctx, LOGMEM(ctx), LY_EMEM);
    xmlctx->ctx = ctx;
    xmlctx->in = in;

    ly_log_location(NULL, NULL, NULL, in);

    /* parse next element, if any */
    LY_CHECK_GOTO(ret = lyxml_next_element(xmlctx, &xmlctx->prefix, &xmlctx->prefix_len, &xmlctx->name,
            &xmlctx->name_len, &closing), cleanup);

    if (xmlctx->in->current[0] == '\0') {
        /* update status */
        xmlctx->status = LYXML_END;
    } else if (closing) {
        LOGVAL(ctx, LYVE_SYNTAX, "Stray closing element tag (\"%.*s\").", (int)xmlctx->name_len, xmlctx->name);
        ret = LY_EVALID;
        goto cleanup;
    } else {
        /* open an element, also parses all enclosed namespaces */
        LY_CHECK_GOTO(ret = lyxml_open_element(xmlctx, xmlctx->prefix, xmlctx->prefix_len, xmlctx->name, xmlctx->name_len), cleanup);

        /* update status */
        xmlctx->status = LYXML_ELEMENT;
    }

cleanup:
    if (ret) {
        lyxml_ctx_free(xmlctx);
    } else {
        *xmlctx_p = xmlctx;
    }
    return ret;
}